

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O3

vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> * __thiscall
sc_core::sc_vector_base::get_elements(sc_vector_base *this)

{
  pointer *pppsVar1;
  iterator __position;
  int iVar2;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *pvVar3;
  undefined4 extraout_var;
  pointer ppsVar4;
  long lVar5;
  pointer ppsVar6;
  sc_object *obj;
  sc_object *local_20;
  
  pvVar3 = this->objs_vec_;
  if (pvVar3 == (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)0x0) {
    pvVar3 = (vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
             operator_new(0x18);
    (pvVar3->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar3->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar3->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->objs_vec_ = pvVar3;
    ppsVar4 = (pointer)0x0;
  }
  else {
    ppsVar4 = (pvVar3->
              super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (((pvVar3->super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
       _M_impl.super__Vector_impl_data._M_finish == ppsVar4) &&
     (lVar5 = (long)(this->vec_).
                    super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vec_).
                    super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar5 != 0)) {
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::reserve
              (pvVar3,lVar5 >> 3);
    ppsVar6 = (this->vec_).
              super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppsVar6 !=
        (this->vec_).
        super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar2 = (*(this->super_sc_object)._vptr_sc_object[0xf])(this,*ppsVar6);
        local_20 = (sc_object *)CONCAT44(extraout_var,iVar2);
        if (local_20 != (sc_object *)0x0) {
          pvVar3 = this->objs_vec_;
          __position._M_current =
               (pvVar3->
               super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pvVar3->
              super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::
            _M_realloc_insert(pvVar3,__position,&local_20);
          }
          else {
            *__position._M_current = local_20;
            pppsVar1 = &(pvVar3->
                        super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppsVar1 = *pppsVar1 + 1;
          }
        }
        ppsVar6 = ppsVar6 + 1;
      } while (ppsVar6 !=
               (this->vec_).
               super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return this->objs_vec_;
}

Assistant:

std::vector< sc_object* > const &
sc_vector_base::get_elements() const
{
  if( !objs_vec_ )
    objs_vec_ = new std::vector< sc_object* >;

  if( objs_vec_->size() || !size() )
    return *objs_vec_;

  objs_vec_->reserve( size() );
  for( const_iterator it=begin(); it != end(); ++it )
    if( sc_object* obj = object_cast(*it) )
      objs_vec_->push_back( obj );

  return *objs_vec_;
}